

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O1

bool __thiscall
HdlcSimulationDataGenerator::ContainsElement(HdlcSimulationDataGenerator *this,U32 index)

{
  U32 *pUVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  
  pUVar1 = (this->mAbortFramesIndexes).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = (long)(this->mAbortFramesIndexes).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pUVar1;
  bVar6 = lVar2 != 0;
  if ((bVar6) && (*pUVar1 != index)) {
    uVar3 = lVar2 >> 2;
    uVar4 = 1;
    do {
      uVar5 = (ulong)uVar4;
      bVar6 = uVar5 < uVar3;
      if (uVar3 <= uVar5) {
        return bVar6;
      }
      uVar4 = uVar4 + 1;
    } while (pUVar1[uVar5] != index);
  }
  return bVar6;
}

Assistant:

bool HdlcSimulationDataGenerator::ContainsElement( U32 index ) const
{
    for( U32 i = 0; i < mAbortFramesIndexes.size(); ++i )
    {
        if( mAbortFramesIndexes.at( i ) == index )
        {
            return true;
        }
    }
    return false;
}